

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmath.c
# Opt level: O0

int do_stdin(void)

{
  long lVar1;
  int iVar2;
  ssize_t sVar3;
  bool bVar4;
  long lStack_1230;
  int err;
  ssize_t buff_index;
  char read_buff [4096];
  char expr [512];
  size_t local_20;
  ssize_t expr_index;
  ssize_t bytes_read;
  
  local_20 = 0;
  memset(read_buff + 0xff8,0,0x200);
  do {
    memset(&buff_index,0,0x1000);
    lStack_1230 = 0;
    sVar3 = read(0,&buff_index,0x1000);
    if (sVar3 < 0) {
      perror("do_stdin() error reading line");
      return 1;
    }
    if (sVar3 == 0) break;
    while (lStack_1230 < sVar3) {
      if ((long)local_20 < 0x201) {
        if (read_buff[lStack_1230 + -8] == '\n') {
          iVar2 = evaluate(read_buff + 0xff8,local_20,true);
          if (iVar2 == 0) {
            puts("");
          }
          memset(read_buff + 0xff8,0,local_20);
          local_20 = 0;
          lStack_1230 = lStack_1230 + 1;
        }
        else {
          read_buff[local_20 + 0xff8] = read_buff[lStack_1230 + -8];
          local_20 = local_20 + 1;
          lStack_1230 = lStack_1230 + 1;
        }
      }
      else {
        fputs("Attempted input buffer overflow. Skipping.\n",stderr);
        memset(read_buff + 0xff8,0,0x200);
        local_20 = 0;
        lVar1 = lStack_1230;
        do {
          lStack_1230 = lVar1;
          bVar4 = false;
          if (lStack_1230 < sVar3) {
            bVar4 = read_buff[lStack_1230 + -7] != '\n';
          }
          lVar1 = lStack_1230 + 1;
        } while (bVar4);
        lStack_1230 = lStack_1230 + 2;
      }
    }
  } while (0 < sVar3);
  fflush(stdout);
  return 0;
}

Assistant:

static int do_stdin()
{
#define BUF_SIZE 4096
	ssize_t bytes_read = 0;
	ssize_t expr_index = 0;
	char expr[P_MAX_EXP_LEN] = { 0 };

	do {
		char read_buff[BUF_SIZE] = { 0 };
		ssize_t buff_index = 0;

		bytes_read = read(STDIN_FILENO, read_buff, sizeof(read_buff));
		if (bytes_read < 0) {
			perror("do_stdin() error reading line");
			return EXIT_FAILURE;
		}

		if (bytes_read == 0)
			break;

		while (buff_index < bytes_read) {
			if (unlikely(expr_index > P_MAX_EXP_LEN)) {
				fputs("Attempted input buffer overflow. Skipping.\n",
				      stderr);
				memset(expr, '\0', P_MAX_EXP_LEN);
				expr_index = 0;
				while (buff_index++ < bytes_read &&
				       read_buff[buff_index] != '\n')
					;
				buff_index++;
				continue;
			}

			if (read_buff[buff_index] == '\n') {
				int err = evaluate(expr, expr_index, true);
				if (!err) {
					puts("");
				}
				memset(expr, '\0', expr_index);
				expr_index = 0;
				buff_index++;
				continue;
			}

			expr[expr_index] = read_buff[buff_index];
			expr_index++;
			buff_index++;
		}

	} while (bytes_read > 0);

	fflush(stdout);

	return EXIT_SUCCESS;
}